

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Vertex.h
# Opt level: O3

void __thiscall Assimp::Vertex::SortBack(Vertex *this,aiMesh *out,uint idx)

{
  undefined8 *puVar1;
  undefined8 *puVar2;
  aiVector3D *paVar3;
  long lVar4;
  ulong uVar5;
  undefined8 uVar6;
  float fVar7;
  aiVector3D *paVar8;
  uint i;
  long lVar9;
  
  if (out->mNumVertices <= idx) {
    __assert_fail("idx<out->mNumVertices",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/wbrbr[P]realtime/external/assimp/include/assimp/Vertex.h"
                  ,0xc9,"void Assimp::Vertex::SortBack(aiMesh *, unsigned int) const");
  }
  paVar8 = out->mVertices;
  uVar5 = (ulong)idx;
  paVar8[uVar5].z = (this->position).z;
  fVar7 = (this->position).y;
  paVar8 = paVar8 + uVar5;
  paVar8->x = (this->position).x;
  paVar8->y = fVar7;
  paVar8 = out->mNormals;
  if ((paVar8 != (aiVector3D *)0x0) && (out->mNumVertices != 0)) {
    paVar8[uVar5].z = (this->normal).z;
    fVar7 = (this->normal).y;
    paVar8[uVar5].x = (this->normal).x;
    paVar8[uVar5].y = fVar7;
  }
  paVar8 = out->mTangents;
  if (((paVar8 != (aiVector3D *)0x0) && (out->mBitangents != (aiVector3D *)0x0)) &&
     (out->mNumVertices != 0)) {
    paVar8[uVar5].z = (this->tangent).z;
    fVar7 = (this->tangent).y;
    paVar8[uVar5].x = (this->tangent).x;
    paVar8[uVar5].y = fVar7;
    paVar8 = out->mBitangents;
    paVar8[uVar5].z = (this->bitangent).z;
    fVar7 = (this->bitangent).y;
    paVar8 = paVar8 + uVar5;
    paVar8->x = (this->bitangent).x;
    paVar8->y = fVar7;
  }
  paVar8 = this->texcoords;
  lVar9 = 0;
  do {
    paVar3 = out->mTextureCoords[lVar9];
    if ((paVar3 == (aiVector3D *)0x0) || (out->mNumVertices == 0)) break;
    paVar3[uVar5].z = paVar8->z;
    fVar7 = paVar8->y;
    paVar3[uVar5].x = paVar8->x;
    paVar3[uVar5].y = fVar7;
    lVar9 = lVar9 + 1;
    paVar8 = paVar8 + 1;
  } while (lVar9 != 8);
  lVar9 = 0;
  while( true ) {
    lVar4 = *(long *)((long)out->mColors + lVar9);
    if (lVar4 == 0) {
      return;
    }
    if (out->mNumVertices == 0) break;
    puVar1 = (undefined8 *)((long)&this->colors[0].r + lVar9 * 2);
    uVar6 = puVar1[1];
    puVar2 = (undefined8 *)(lVar4 + uVar5 * 0x10);
    *puVar2 = *puVar1;
    puVar2[1] = uVar6;
    lVar9 = lVar9 + 8;
    if (lVar9 == 0x40) {
      return;
    }
  }
  return;
}

Assistant:

void SortBack(aiMesh* out, unsigned int idx) const {

        ai_assert(idx<out->mNumVertices);
        out->mVertices[idx] = position;

        if (out->HasNormals()) {
            out->mNormals[idx] = normal;
        }

        if (out->HasTangentsAndBitangents()) {
            out->mTangents[idx] = tangent;
            out->mBitangents[idx] = bitangent;
        }

        for(unsigned int i = 0; out->HasTextureCoords(i); ++i) {
            out->mTextureCoords[i][idx] = texcoords[i];
        }

        for(unsigned int i = 0; out->HasVertexColors(i); ++i) {
            out->mColors[i][idx] = colors[i];
        }
    }